

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O0

void planck_unit_run_suite(planck_unit_suite_t *suite)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long end_time;
  unsigned_long start_time;
  planck_unit_test_t *state;
  planck_unit_suite_t *suite_local;
  
  suite->total_time = 0;
  start_time = (unsigned_long)suite->head;
  (*(suite->print_functions).print_preamble)(suite);
  for (; start_time != 0; start_time = *(unsigned_long *)(start_time + 0x30)) {
    uVar2 = ion_time();
    iVar1 = _setjmp((__jmp_buf_tag *)planck_unit_longjmp_env);
    if (iVar1 == 0) {
      (**(code **)(start_time + 0x28))(start_time);
    }
    uVar3 = ion_time();
    suite->total_tests = suite->total_tests + 1;
    if (*(char *)start_time == '\x01') {
      suite->total_passed = suite->total_passed + 1;
    }
    *(unsigned_long *)(start_time + 0x48) = uVar3 - uVar2;
    suite->total_time = suite->total_time + *(long *)(start_time + 0x48);
    (*(suite->print_functions).print_result)((planck_unit_test_t *)start_time);
    if ((*(char *)start_time == '\0') && (*(char *)(start_time + 0x40) == '\x01')) {
      free(*(void **)(start_time + 0x20));
    }
  }
  (*(suite->print_functions).print_postamble)(suite);
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void
planck_unit_run_suite(
	planck_unit_suite_t *suite
) {
	planck_unit_test_t		*state;
	volatile unsigned long	start_time, end_time;

	suite->total_time = 0;

	state = suite->head;

	suite->print_functions.print_preamble(suite);

	while (NULL != state) {
		start_time = ion_time();

		if (0 == setjmp(planck_unit_longjmp_env)) {
			state->test_func(state);
		}

		end_time = ion_time();
		suite->total_tests++;

		if (PLANCK_UNIT_SUCCESS == state->result) {
			suite->total_passed++;
		}

		state->time = end_time - start_time;
		suite->total_time = suite->total_time + state->time;
		suite->print_functions.print_result(state);

		if ((PLANCK_UNIT_FAILURE == state->result) && (1 == state->allocated_message)) {
			free(state->message);
		}

		state = state->next;
	}

	suite->print_functions.print_postamble(suite);
	PLANCK_UNIT_PRINT_NEWLINE;
}